

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::validateVariable
          (ValidatorImpl *this,VariablePtr *variable,NameList *variableNames)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  IssueImpl *pIVar1;
  bool bVar2;
  byte bVar3;
  element_type *peVar4;
  ulong uVar5;
  const_iterator __first;
  const_iterator __last;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *this_01;
  element_type *this_02;
  string local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  undefined1 local_7b0 [8];
  IssuePtr issue_7;
  string initialValue;
  string local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  undefined1 local_680 [8];
  IssuePtr issue_6;
  string interfaceType;
  string local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  undefined1 local_550 [8];
  IssuePtr issue_5;
  undefined1 local_530 [8];
  ModelPtr model;
  string local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  undefined1 local_400 [8];
  IssuePtr issue_4;
  undefined1 local_3e0 [8];
  string unitsName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  IssuePtr issue_3;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  IssuePtr issue_2;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  IssuePtr issue_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  IssuePtr issue;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  undefined1 local_70 [8];
  string variableName;
  shared_ptr<const_libcellml::ParentedEntity> local_40;
  undefined1 local_30 [8];
  ComponentPtr component;
  NameList *variableNames_local;
  VariablePtr *variable_local;
  ValidatorImpl *this_local;
  
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)variableNames;
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_40,variable);
  owningComponent((libcellml *)local_30,(ParentedEntityConstPtr *)&local_40);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_40);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  NamedEntity::name_abi_cxx11_((string *)local_70,&peVar4->super_NamedEntity);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)component.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi);
    local_78 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (__first._M_current,__last._M_current,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70);
    issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    bVar2 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (bVar2) {
      Issue::IssueImpl::create();
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a0);
      pIVar1 = peVar6->mPimpl;
      peVar7 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      NamedEntity::name_abi_cxx11_
                ((string *)
                 &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(NamedEntity *)peVar7);
      std::operator+(&local_120,"Component \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::operator+(&local_100,&local_120,"\' contains multiple variables with the name \'");
      std::operator+(&local_e0,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_c0,&local_e0,
                     "\'. Valid variable names must be unique to their component.");
      Issue::IssueImpl::setDescription(pIVar1,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string
                ((string *)
                 &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a0);
      peVar8 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setComponent
                (peVar8->mPimpl,(ComponentPtr *)local_30,COMPONENT);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a0);
      Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_NAME_UNIQUE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_a0);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_a0);
    }
  }
  bVar2 = isCellmlIdentifier((string *)local_70);
  if (!bVar2) {
    makeIssueIllegalIdentifier((ValidatorImpl *)local_150,(string *)this);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_150);
    pIVar1 = peVar6->mPimpl;
    std::operator+(&local_1f0,"Variable \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::operator+(&local_1d0,&local_1f0,"\' in component \'");
    peVar7 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    NamedEntity::name_abi_cxx11_(&local_210,(NamedEntity *)peVar7);
    std::operator+(&local_1b0,&local_1d0,&local_210);
    std::operator+(&local_190,&local_1b0,"\' does not have a valid name attribute. ");
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_150);
    Issue::description_abi_cxx11_(&local_230,peVar6);
    std::operator+(&local_170,&local_190,&local_230);
    Issue::IssueImpl::setDescription(pIVar1,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_150);
    peVar8 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar8->mPimpl,variable);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_150);
    Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_NAME_VALUE);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_150);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_150);
  }
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  Entity::id_abi_cxx11_
            ((string *)
             &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Entity *)peVar4);
  bVar2 = isValidXmlName((string *)
                         &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    Issue::IssueImpl::create();
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_260);
    Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,XML_ID_ATTRIBUTE);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_260);
    peVar8 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar8->mPimpl,variable);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_260);
    pIVar1 = peVar6->mPimpl;
    std::operator+(&local_2e0,"Variable \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::operator+(&local_2c0,&local_2e0,"\' does not have a valid \'id\' attribute, \'");
    peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    Entity::id_abi_cxx11_(&local_300,(Entity *)peVar4);
    std::operator+(&local_2a0,&local_2c0,&local_300);
    std::operator+(&local_280,&local_2a0,"\'.");
    Issue::IssueImpl::setDescription(pIVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_260);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_260);
  }
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             variable);
  Variable::units((Variable *)
                  &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
  bVar2 = std::operator==((shared_ptr<libcellml::Units> *)
                          &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar2) {
    Issue::IssueImpl::create();
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_320);
    pIVar1 = peVar6->mPimpl;
    std::operator+(&local_3a0,"Variable \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    std::operator+(&local_380,&local_3a0,"\' in component \'");
    peVar7 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    NamedEntity::name_abi_cxx11_((string *)((long)&unitsName.field_2 + 8),(NamedEntity *)peVar7);
    std::operator+(&local_360,&local_380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&unitsName.field_2 + 8));
    std::operator+(&local_340,&local_360,"\' does not have any units specified.");
    Issue::IssueImpl::setDescription(pIVar1,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)(unitsName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_320);
    peVar8 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar8->mPimpl,variable);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_320);
    Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_UNITS_VALUE);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_320);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_320);
  }
  else {
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )variable);
    Variable::units((Variable *)
                    &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
    this_01 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&issue_4.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    NamedEntity::name_abi_cxx11_((string *)local_3e0,&this_01->super_NamedEntity);
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)
               &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    bVar2 = isCellmlIdentifier((string *)local_3e0);
    if (bVar2) {
      bVar2 = isStandardUnitName((string *)local_3e0);
      if (!bVar2) {
        this_00 = &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
                  ((shared_ptr<libcellml::ParentedEntity_const> *)this_00,
                   (shared_ptr<libcellml::Component> *)local_30);
        owningModel((libcellml *)local_530,(ParentedEntityConstPtr *)this_00);
        std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
                  ((shared_ptr<const_libcellml::ParentedEntity> *)
                   &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_02 = std::
                  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_530);
        bVar2 = Model::hasUnits(this_02,(string *)local_3e0);
        if (!bVar2) {
          Issue::IssueImpl::create();
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_550);
          pIVar1 = peVar6->mPimpl;
          std::operator+(&local_610,"Variable \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70);
          std::operator+(&local_5f0,&local_610,"\' in component \'");
          peVar7 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          NamedEntity::name_abi_cxx11_(&local_630,(NamedEntity *)peVar7);
          std::operator+(&local_5d0,&local_5f0,&local_630);
          std::operator+(&local_5b0,&local_5d0,"\' has a units reference \'");
          std::operator+(&local_590,&local_5b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3e0);
          std::operator+(&local_570,&local_590,
                         "\' which is neither standard nor defined in the parent model.");
          Issue::IssueImpl::setDescription(pIVar1,&local_570);
          std::__cxx11::string::~string((string *)&local_570);
          std::__cxx11::string::~string((string *)&local_590);
          std::__cxx11::string::~string((string *)&local_5b0);
          std::__cxx11::string::~string((string *)&local_5d0);
          std::__cxx11::string::~string((string *)&local_630);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::__cxx11::string::~string((string *)&local_610);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_550);
          peVar8 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar6->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar8->mPimpl,variable);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_550);
          Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_UNITS_VALUE);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_550);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_550);
        }
        std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_530);
      }
    }
    else {
      makeIssueIllegalIdentifier((ValidatorImpl *)local_400,(string *)this);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_400);
      pIVar1 = peVar6->mPimpl;
      std::operator+(&local_4e0,"Variable \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_4c0,&local_4e0,"\' in component \'");
      peVar7 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      NamedEntity::name_abi_cxx11_(&local_500,(NamedEntity *)peVar7);
      std::operator+(&local_4a0,&local_4c0,&local_500);
      std::operator+(&local_480,&local_4a0,
                     "\' does not have a valid units attribute. The attribute given is \'");
      std::operator+(&local_460,&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0)
      ;
      std::operator+(&local_440,&local_460,"\'. ");
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_400);
      Issue::description_abi_cxx11_
                ((string *)
                 &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,peVar6);
      std::operator+(&local_420,&local_440,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      Issue::IssueImpl::setDescription(pIVar1,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string
                ((string *)
                 &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_400);
      peVar8 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar8->mPimpl,variable);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_400);
      Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_UNITS_VALUE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_400);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_400);
    }
    std::__cxx11::string::~string((string *)local_3e0);
  }
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  Variable::interfaceType_abi_cxx11_((string *)((long)&interfaceType.field_2 + 8),peVar4);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)(interfaceType.field_2._M_local_buf + 8));
  if (((bVar3 ^ 0xff) & 1) != 0) {
    peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    Variable::interfaceType_abi_cxx11_
              ((string *)
               &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,peVar4);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &issue_6.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,"public");
    if ((((bVar2) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&issue_6.
                                      super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,"private"), bVar2)) &&
        (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&issue_6.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,"none"), bVar2)) &&
       (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&issue_6.
                                  super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,"public_and_private"), bVar2)) {
      Issue::IssueImpl::create();
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_680);
      pIVar1 = peVar6->mPimpl;
      std::operator+(&local_740,"Variable \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_720,&local_740,"\' in component \'");
      peVar7 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      NamedEntity::name_abi_cxx11_(&local_760,(NamedEntity *)peVar7);
      std::operator+(&local_700,&local_720,&local_760);
      std::operator+(&local_6e0,&local_700,"\' has an invalid interface attribute value \'");
      std::operator+(&local_6c0,&local_6e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::operator+(&local_6a0,&local_6c0,"\'.");
      Issue::IssueImpl::setDescription(pIVar1,&local_6a0);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_760);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)&local_740);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_680);
      peVar8 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar8->mPimpl,variable);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_680);
      Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_INTERFACE_VALUE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_680);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_680);
    }
    std::__cxx11::string::~string
              ((string *)
               &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  Variable::initialValue_abi_cxx11_((string *)((long)&initialValue.field_2 + 8),peVar4);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)(initialValue.field_2._M_local_buf + 8));
  if (((bVar3 ^ 0xff) & 1) != 0) {
    peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    Variable::initialValue_abi_cxx11_
              ((string *)
               &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,peVar4);
    peVar7 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    bVar2 = Component::hasVariable
                      (peVar7,(string *)
                              &issue_7.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
    if ((!bVar2) &&
       (bVar2 = isCellMLReal((string *)
                             &issue_7.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount), !bVar2)) {
      Issue::IssueImpl::create();
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_7b0);
      pIVar1 = peVar6->mPimpl;
      std::operator+(&local_870,"Variable \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_850,&local_870,"\' in component \'");
      peVar7 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      NamedEntity::name_abi_cxx11_(&local_890,(NamedEntity *)peVar7);
      std::operator+(&local_830,&local_850,&local_890);
      std::operator+(&local_810,&local_830,"\' has an invalid initial value \'");
      std::operator+(&local_7f0,&local_810,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::operator+(&local_7d0,&local_7f0,
                     "\'. Initial values must be a real number string or a variable reference.");
      Issue::IssueImpl::setDescription(pIVar1,&local_7d0);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::__cxx11::string::~string((string *)&local_810);
      std::__cxx11::string::~string((string *)&local_830);
      std::__cxx11::string::~string((string *)&local_890);
      std::__cxx11::string::~string((string *)&local_850);
      std::__cxx11::string::~string((string *)&local_870);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_7b0);
      peVar8 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar8->mPimpl,variable);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_7b0);
      Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,VARIABLE_INITIAL_VALUE_VALUE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_7b0);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_7b0);
    }
    std::__cxx11::string::~string
              ((string *)
               &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  std::__cxx11::string::~string((string *)local_70);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_30);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateVariable(const VariablePtr &variable, const NameList &variableNames)
{
    ComponentPtr component = owningComponent(variable);
    auto variableName = variable->name();
    if (!variableName.empty()) {
        if (std::find(variableNames.begin(), variableNames.end(), variableName) != variableNames.end()) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Component '" + component->name() + "' contains multiple variables with the name '" + variableName + "'. Valid variable names must be unique to their component.");
            issue->mPimpl->mItem->mPimpl->setComponent(component);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_NAME_UNIQUE);
            addIssue(issue);
        }
    }

    // Check for a valid name attribute.
    if (!isCellmlIdentifier(variableName)) {
        auto issue = makeIssueIllegalIdentifier(variableName);
        issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have a valid name attribute. " + issue->description());
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_NAME_VALUE);
        addIssue(issue);
    }
    // Check for a valid identifier.
    if (!isValidXmlName(variable->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setDescription("Variable '" + variableName + "' does not have a valid 'id' attribute, '" + variable->id() + "'.");
        addIssue(issue);
    }
    // Check for a valid units attribute.
    if (variable->units() == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have any units specified.");
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
        addIssue(issue);
    } else {
        std::string unitsName = variable->units()->name();
        if (!isCellmlIdentifier(unitsName)) {
            auto issue = makeIssueIllegalIdentifier(unitsName);
            issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' does not have a valid units attribute. The attribute given is '" + unitsName + "'. " + issue->description());
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
            addIssue(issue);
        } else if (!isStandardUnitName(unitsName)) {
            ModelPtr model = owningModel(component);
            if (!model->hasUnits(unitsName)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has a units reference '" + unitsName + "' which is neither standard nor defined in the parent model.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_UNITS_VALUE);
                addIssue(issue);
            }
        }
    }
    // Check for a valid interface attribute.
    if (!variable->interfaceType().empty()) {
        std::string interfaceType = variable->interfaceType();
        if ((interfaceType != "public") && (interfaceType != "private") && (interfaceType != "none") && (interfaceType != "public_and_private")) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has an invalid interface attribute value '" + interfaceType + "'.");
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_INTERFACE_VALUE);
            addIssue(issue);
        }
    }
    // Check for a valid initial value attribute.
    if (!variable->initialValue().empty()) {
        std::string initialValue = variable->initialValue();
        // Check if initial value is a variable reference
        if (!component->hasVariable(initialValue)) {
            // Otherwise, check that the initial value can be converted to a double
            if (!isCellMLReal(initialValue)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + variableName + "' in component '" + component->name() + "' has an invalid initial value '" + initialValue + "'. Initial values must be a real number string or a variable reference.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_INITIAL_VALUE_VALUE);
                addIssue(issue);
            }
        }
    }
}